

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void tcp_pinger_v6_new(int vectored_writes)

{
  int iVar1;
  int *piVar2;
  uv_loop_t *loop;
  sockaddr_in6 server_addr;
  sockaddr_in6 local_34;
  
  iVar1 = uv_ip6_addr("::1",0x23a3,&local_34);
  if (iVar1 == 0) {
    piVar2 = (int *)malloc(0x2978);
    if (piVar2 == (int *)0x0) goto LAB_001620c2;
    *piVar2 = vectored_writes;
    piVar2[1] = 0;
    piVar2[2] = 0;
    loop = uv_default_loop();
    iVar1 = uv_tcp_init(loop,(uv_tcp_t *)(piVar2 + 4));
    *(int **)(piVar2 + 4) = piVar2;
    if (iVar1 != 0) goto LAB_001620c7;
    iVar1 = uv_tcp_connect((uv_connect_t *)(piVar2 + 0x46),(uv_tcp_t *)(piVar2 + 4),
                           (sockaddr *)&local_34,pinger_on_connect);
    if (iVar1 == 0) {
      if (pinger_on_connect_count == 0) {
        return;
      }
      goto LAB_001620d1;
    }
  }
  else {
    tcp_pinger_v6_new_cold_1();
LAB_001620c2:
    tcp_pinger_v6_new_cold_5();
LAB_001620c7:
    tcp_pinger_v6_new_cold_2();
  }
  tcp_pinger_v6_new_cold_3();
LAB_001620d1:
  tcp_pinger_v6_new_cold_4();
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    run_test_tcp6_ping_pong_vec_cold_1();
  }
  else {
    tcp_pinger_v6_new(1);
    run_ping_pong_test();
  }
  return;
}

Assistant:

static void tcp_pinger_v6_new(int vectored_writes) {
  int r;
  struct sockaddr_in6 server_addr;
  pinger_t *pinger;


  ASSERT(0 ==uv_ip6_addr("::1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT(pinger != NULL);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT(!r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT(pinger_on_connect_count == 0);
}